

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O1

void __thiscall testing::internal::PrintTo(internal *this,__uint128_t v,ostream *os)

{
  ulong uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  size_t sVar4;
  ostream *in_RDX;
  ostream *poVar5;
  byte *__s;
  byte local_22 [10];
  
  if (this == (internal *)0x0 && os == (ostream *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(in_RDX,"0",1);
    return;
  }
  __s = local_22 + 1;
  local_22[1] = 0;
  if (this != (internal *)0x0 || os != (ostream *)0x0) {
    do {
      do {
        poVar5 = (ostream *)((ulong)os / 10);
        uVar1 = (ulong)this % 10 + ((ulong)os % 10) * 6;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar1;
        this = (internal *)(((ulong)os % 10) * 0x1999999999999999 + (ulong)this / 10 + uVar1 / 10);
        __s[-1] = (char)uVar1 + SUB161(auVar3 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
        __s = __s + -1;
        bVar2 = (ostream *)0x9 < os;
        os = poVar5;
      } while (bVar2);
    } while (this != (internal *)0x0);
  }
  sVar4 = strlen((char *)__s);
  std::__ostream_insert<char,std::char_traits<char>>(in_RDX,(char *)__s,sVar4);
  return;
}

Assistant:

void PrintTo(__uint128_t v, ::std::ostream* os) {
  if (v == 0) {
    *os << "0";
    return;
  }

  // Buffer large enough for ceil(log10(2^128))==39 and the null terminator
  char buf[40];
  char* p = buf + sizeof(buf);

  // Some configurations have a __uint128_t, but no support for built in
  // division. Do manual long division instead.

  uint64_t high = static_cast<uint64_t>(v >> 64);
  uint64_t low = static_cast<uint64_t>(v);

  *--p = 0;
  while (high != 0 || low != 0) {
    uint64_t high_mod = high % 10;
    high = high / 10;
    // This is the long division algorithm specialized for a divisor of 10 and
    // only two elements.
    // Notable values:
    //   2^64 / 10 == 1844674407370955161
    //   2^64 % 10 == 6
    const uint64_t carry = 6 * high_mod + low % 10;
    low = low / 10 + high_mod * 1844674407370955161 + carry / 10;

    char digit = static_cast<char>(carry % 10);
    *--p = '0' + digit;
  }
  *os << p;
}